

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productFull<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar12;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar9 = (long)(x->super_IdxSet).num;
  if (0 < lVar9) {
    bVar7 = true;
    lVar10 = 0;
    do {
      iVar3 = (x->super_IdxSet).idx[lVar10];
      pnVar4 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[iVar3].m_backend.data + 0x20);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar3].m_backend.data;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar3].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x10);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_a8.exp = pnVar4[iVar3].m_backend.exp;
      local_a8.neg = pnVar4[iVar3].m_backend.neg;
      local_a8.fpclass = pnVar4[iVar3].m_backend.fpclass;
      local_a8.prec_elem = pnVar4[iVar3].m_backend.prec_elem;
      pIVar5 = (A->set).theitem;
      iVar3 = (A->set).thekey[iVar3].idx;
      bVar8 = bVar7;
      if (bVar7) {
        bVar8 = false;
      }
      lVar11 = (long)pIVar5[iVar3].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar11) {
        lVar12 = 0;
        do {
          pNVar6 = pIVar5[iVar3].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar6->val).m_backend.data + lVar12);
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68.data._M_elems[9]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          v = &local_a8;
          if (pcVar1 != &local_68) {
            local_68.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
            local_68.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
            local_68.data._M_elems[4] = local_a8.data._M_elems[4];
            local_68.data._M_elems[5] = local_a8.data._M_elems[5];
            local_68.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
            local_68.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
            local_68.data._M_elems[0] = local_a8.data._M_elems[0];
            local_68.data._M_elems[1] = local_a8.data._M_elems[1];
            local_68.data._M_elems[2] = local_a8.data._M_elems[2];
            local_68.data._M_elems[3] = local_a8.data._M_elems[3];
            local_68.exp = local_a8.exp;
            local_68.neg = local_a8.neg;
            local_68.fpclass = local_a8.fpclass;
            local_68.prec_elem = local_a8.prec_elem;
            v = pcVar1;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_68,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)
                     ((long)*(int *)((long)(&pNVar6->val + 1) + lVar12) * 0x38 +
                     *(long *)(this + 0x20)),&local_68);
          lVar12 = lVar12 + 0x3c;
          bVar7 = bVar8;
        } while (lVar11 * 0x3c - lVar12 != 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
    if (!bVar7) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productFull(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   bool A_is_zero = true;
   int xsize = x.size();
   int Aisize;

   for(int i = 0; i < xsize; ++i)
   {
      const int curidx = x.idx[i];
      const T xi = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];
      Aisize = Ai.size();

      if(A_is_zero && Aisize > 0)
         A_is_zero = false;

      for(int j = 0; j < Aisize; ++j)
      {
         const Nonzero<S>& elt = Ai.element(j);
         VectorBase<R>::val[elt.idx] += xi * elt.val;
      }
   }

   if(A_is_zero)
      clear(); // case x != 0 but A == 0

   return *this;
}